

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

void __thiscall GainBuckets::delCell(GainBuckets *this,int gain,const_iterator iter)

{
  bool bVar1;
  Bucket *pBVar2;
  int gain_local;
  GainBuckets *this_local;
  const_iterator iter_local;
  
  this->num_elems_ = this->num_elems_ - 1;
  pBVar2 = operator[][abi_cxx11_(this,gain);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::erase(pBVar2,iter);
  if (this->best_gain_ == gain) {
    while( true ) {
      pBVar2 = operator[][abi_cxx11_(this,this->best_gain_);
      bVar1 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty(pBVar2);
      if (!bVar1) break;
      if (this->best_gain_ == -this->max_gain_) {
        this->best_gain_ = -0x80000000;
        return;
      }
      this->best_gain_ = this->best_gain_ + -1;
    }
  }
  return;
}

Assistant:

void GainBuckets::delCell(int gain, GainBuckets::Bucket::const_iterator iter) {
  --num_elems_;
  (*this)[gain].erase(iter);
  if (best_gain_ == gain)
    while ((*this)[best_gain_].empty()) {
      if (best_gain_ == -(int)max_gain_) {
        best_gain_ = INT_MIN;
        break;
      }
      --best_gain_;
    }
}